

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard-graphics.cpp
# Opt level: O0

Graphics * __thiscall
Game::Gameboard::Graphics::GameBoardTextOutput_abi_cxx11_(Graphics *this,GameBoard *gb)

{
  tuple<unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_> local_38;
  GameBoard *local_18;
  GameBoard *gb_local;
  
  local_18 = gb;
  gb_local = (GameBoard *)this;
  std::tuple<unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::tuple
            (&local_38,&gb->gbda);
  (anonymous_namespace)::drawSelf_abi_cxx11_((_anonymous_namespace_ *)this,&local_38);
  std::tuple<unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::~tuple
            (&local_38);
  return this;
}

Assistant:

std::string GameBoardTextOutput(GameBoard gb) {
  return drawSelf(gb.gbda);
}